

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_geometry.cpp
# Opt level: O1

bool __thiscall ON_Geometry::Translate(ON_Geometry *this,ON_3dVector *delta)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  ON_Xform tr;
  ON_Xform OStack_98;
  
  bVar1 = ON_3dVector::IsZero(delta);
  uVar2 = 1;
  if (!bVar1) {
    bVar1 = ON_3dVector::IsValid(delta);
    if (bVar1) {
      ON_Xform::TranslationTransformation(&OStack_98,delta);
      iVar3 = (*(this->super_ON_Object)._vptr_ON_Object[0x1c])(this,&OStack_98);
      uVar2 = (undefined1)iVar3;
    }
    else {
      uVar2 = 0;
    }
  }
  return (bool)uVar2;
}

Assistant:

bool ON_Geometry::Translate( const ON_3dVector& delta )
{
  if ( delta.IsZero() )
    return true;
  if ( false == delta.IsValid() )
    return false;
  const ON_Xform tr(ON_Xform::TranslationTransformation( delta ));
  return (0!=Transform( tr ));
}